

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_parse_server_ecdh_params(mbedtls_ssl_context *ssl,uchar **p,uchar *end)

{
  int iVar1;
  int iVar2;
  
  iVar1 = mbedtls_ecdhopt_read_initiator(&ssl->handshake->ecdh_ctx,p,end);
  if (iVar1 == 0) {
    iVar2 = ssl_check_server_ecdh_params(ssl);
    iVar1 = -0x7b00;
    if (iVar2 == 0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int ssl_parse_server_ecdh_params( mbedtls_ssl_context *ssl,
                                         unsigned char **p,
                                         unsigned char *end )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;

    /*
     * Ephemeral ECDH parameters:
     *
     * struct {
     *     ECParameters curve_params;
     *     ECPoint      public;
     * } ServerECDHParams;
     */
    if( ( ret = mbedtls_ecdhopt_read_initiator( &ssl->handshake->ecdh_ctx,
                                  (const unsigned char **) p, end ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, ( "mbedtls_ecdhopt_read_initiator" ), ret );
        return( ret );
    }

    if( ssl_check_server_ecdh_params( ssl ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message (ECDHE curve)" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
    }
    return( ret );
}